

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.hpp
# Opt level: O0

void __thiscall
diy::detail::KDTreePartners::incoming
          (KDTreePartners *this,int round,int gid,vector<int,_std::allocator<int>_> *partners,
          Master *m)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int in_ESI;
  RegularAllReducePartners *in_RDI;
  int in_stack_00000058;
  int in_stack_0000005c;
  KDTreePartners *in_stack_00000060;
  Master *in_stack_ffffffffffffffa8;
  KDTreePartners *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  RegularSwapPartners *in_stack_ffffffffffffffc0;
  pointer *partners_00;
  undefined8 in_stack_ffffffffffffffc8;
  
  sVar4 = rounds((KDTreePartners *)0x18e952);
  if (in_ESI == (int)sVar4) {
    link_neighbors(in_stack_00000060,in_stack_0000005c,in_stack_00000058,
                   (vector<int,_std::allocator<int>_> *)this,(Master *)CONCAT44(round,gid));
  }
  else {
    bVar1 = swap_round(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if ((bVar1) &&
       (iVar2 = sub_round(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20))
       , iVar2 < 0)) {
      sub_round(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      RegularSwapPartners::incoming
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                 (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
    }
    else {
      iVar2 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      bVar1 = swap_round(in_stack_ffffffffffffffb0,iVar2);
      if (bVar1) {
        partners_00 = &in_RDI[3].super_RegularMergePartners.super_RegularPartners.kvs_.
                       super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        RegularAllReducePartners::rounds((RegularAllReducePartners *)0x18ea1a);
        RegularAllReducePartners::incoming
                  (in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (int)in_stack_ffffffffffffffc8,(vector<int,_std::allocator<int>_> *)partners_00,
                   (Master *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      else if ((in_ESI < 1) || (iVar3 = sub_round(in_stack_ffffffffffffffb0,iVar2), iVar3 != 0)) {
        if (0 < in_ESI) {
          in_stack_ffffffffffffffbc = sub_round(in_stack_ffffffffffffffb0,iVar2);
          iVar3 = sub_round(in_stack_ffffffffffffffb0,iVar2);
          if (in_stack_ffffffffffffffbc != iVar3 + -1) {
            sub_round((KDTreePartners *)
                      &in_RDI[3].super_RegularMergePartners.super_RegularPartners.kvs_.
                       super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                       ._M_impl.super__Vector_impl_data._M_finish,iVar2);
            RegularAllReducePartners::incoming
                      (in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (int)in_stack_ffffffffffffffc8,
                       (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc0,
                       (Master *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
            return;
          }
        }
        sub_round(in_stack_ffffffffffffffb0,
                  (int)((ulong)&in_RDI[3].super_RegularMergePartners.super_RegularPartners.kvs_.
                                super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                ._M_impl.super__Vector_impl_data._M_finish >> 0x20));
        RegularAllReducePartners::incoming
                  (in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (int)in_stack_ffffffffffffffc8,
                   (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc0,
                   (Master *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      else {
        link_neighbors(in_stack_00000060,in_stack_0000005c,in_stack_00000058,
                       (vector<int,_std::allocator<int>_> *)this,(Master *)CONCAT44(round,gid));
      }
    }
  }
  return;
}

Assistant:

inline void   incoming(int round, int gid, std::vector<int>& partners, const diy::Master& m) const
  {
    if (round == (int) rounds())
        link_neighbors(-1, gid, partners, m);
    else if (swap_round(round) && sub_round(round) < 0)       // link round
        swap.incoming(sub_round(round - 1) + 1, gid, partners, m);
    else if (swap_round(round))
        histogram.incoming(static_cast<int>(histogram.rounds()), gid, partners, m);
    else
    {
        if (round > 0 && sub_round(round) == 0)
            link_neighbors(-1, gid, partners, m);
        else if (round > 0 && sub_round(round - 1) != sub_round(round) - 1)        // jump through the histogram rounds
            histogram.incoming(sub_round(round - 1) + 1, gid, partners, m);
        else
            histogram.incoming(sub_round(round), gid, partners, m);
    }
  }